

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O3

EVP_PKEY * EVP_PKEY_new_raw_private_key(int type,ENGINE *unused,uint8_t *in,size_t len)

{
  code *pcVar1;
  int iVar2;
  EVP_PKEY *pkey;
  EVP_PKEY_ASN1_METHOD *pEVar3;
  
  if (type == 0x3b4) {
    pEVar3 = &x25519_asn1_meth;
  }
  else {
    if (type != 0x3b5) {
      ERR_put_error(6,0,0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp.cc"
                    ,0xf7);
      return (EVP_PKEY *)0x0;
    }
    pEVar3 = &ed25519_asn1_meth;
  }
  pkey = (EVP_PKEY *)OPENSSL_zalloc(0x18);
  if (pkey != (EVP_PKEY *)0x0) {
    pkey->type = 1;
    pkey->save_type = 0;
    if ((pkey->ameth != (EVP_PKEY_ASN1_METHOD *)0x0) &&
       (pcVar1 = *(code **)(pkey->ameth + 0xa0), pcVar1 != (code *)0x0)) {
      (*pcVar1)(pkey);
      *(undefined8 *)&pkey->references = 0;
    }
    pkey->ameth = (EVP_PKEY_ASN1_METHOD *)pEVar3;
    pkey->save_type = pEVar3->pkey_id;
    iVar2 = (*pEVar3->set_priv_raw)((EVP_PKEY *)pkey,in,len);
    if (iVar2 != 0) {
      return (EVP_PKEY *)pkey;
    }
    EVP_PKEY_free(pkey);
  }
  return (EVP_PKEY *)0x0;
}

Assistant:

EVP_PKEY *EVP_PKEY_new_raw_private_key(int type, ENGINE *unused,
                                       const uint8_t *in, size_t len) {
  // To avoid pulling in all key types, look for specifically the key types that
  // support |set_priv_raw|.
  const EVP_PKEY_ASN1_METHOD *method;
  switch (type) {
    case EVP_PKEY_X25519:
      method = &x25519_asn1_meth;
      break;
    case EVP_PKEY_ED25519:
      method = &ed25519_asn1_meth;
      break;
    default:
      OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
      return nullptr;
  }

  bssl::UniquePtr<EVP_PKEY> ret(EVP_PKEY_new());
  if (ret == nullptr) {
    return nullptr;
  }
  evp_pkey_set_method(ret.get(), method);

  if (!ret->ameth->set_priv_raw(ret.get(), in, len)) {
    return nullptr;
  }

  return ret.release();
}